

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O1

void __thiscall
dgrminer::PartialUnion::appendToEncodingLabel(PartialUnion *this,int encoding,string *label)

{
  pointer pcVar1;
  undefined1 local_38 [8];
  _Alloc_hider local_30;
  char local_20 [16];
  
  pcVar1 = (label->_M_dataplus)._M_p;
  local_38._0_4_ = encoding;
  local_30._M_p = local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_30,pcVar1,pcVar1 + label->_M_string_length);
  std::
  _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<int,std::__cxx11::string>>
            ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
              *)&this->encodingLabel,
             (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_38);
  if (local_30._M_p != local_20) {
    operator_delete(local_30._M_p);
  }
  return;
}

Assistant:

void PartialUnion::appendToEncodingLabel(int encoding, string label)
	{
		encodingLabel.insert(std::make_pair(encoding, label));
	}